

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bingo.hpp
# Opt level: O2

void __thiscall BingoGenerator::init_equipment_goals(BingoGenerator *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  
  pvVar1 = &this->_equipment_goals;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[15]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
             (char (*) [15])"Get Iron Boots");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[16]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
             (char (*) [16])"Get Snow Spikes");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[20]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
             (char (*) [20])"Get Fireproof Boots");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[18]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
             (char (*) [18])"Get Healing Boots");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[16]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
             (char (*) [16])"Get Venus Stone");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[17]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
             (char (*) [17])"Get Saturn Stone");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[15]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
             (char (*) [15])"Get Mars Stone");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[15]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
             (char (*) [15])"Get Moon Stone");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[16]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
             (char (*) [16])"Get Magic Sword");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[18]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
             (char (*) [18])"Get Thunder Sword");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[14]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
             (char (*) [14])"Get Ice Sword");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[18]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
             (char (*) [18])"Get Sword of Gaia");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[17]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
             (char (*) [17])"Get Steel Breast");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[18]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
             (char (*) [18])"Get Chrome Breast");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[17]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
             (char (*) [17])"Get Shell Breast");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[17]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
             (char (*) [17])"Get Hyper Breast");
  vectools::shuffle<std::__cxx11::string>(pvVar1,&this->_rng);
  pvVar1 = &this->_global_equipment_goals;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[15]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
             (char (*) [15])"Get all swords");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[15]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
             (char (*) [15])"Get all armors");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[14]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
             (char (*) [14])"Get all rings");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[14]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
             (char (*) [14])"Get all boots");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[31]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
             (char (*) [31])"Equip 2nd column fully (Magic)");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[33]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
             (char (*) [33])"Equip 3rd column fully (Thunder)");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[29]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
             (char (*) [29])"Equip 4th column fully (Ice)");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[30]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
             (char (*) [30])"Equip 5th column fully (Gaia)");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[31]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pvVar1,
             (char (*) [31])"Equip a diagonal of equipments");
  vectools::shuffle<std::__cxx11::string>(pvVar1,&this->_rng);
  return;
}

Assistant:

void init_equipment_goals()
    {
        _equipment_goals.emplace_back("Get Iron Boots");
        _equipment_goals.emplace_back("Get Snow Spikes");
        _equipment_goals.emplace_back("Get Fireproof Boots");
        _equipment_goals.emplace_back("Get Healing Boots");
        _equipment_goals.emplace_back("Get Venus Stone");
        _equipment_goals.emplace_back("Get Saturn Stone");
        _equipment_goals.emplace_back("Get Mars Stone");
        _equipment_goals.emplace_back("Get Moon Stone");
        _equipment_goals.emplace_back("Get Magic Sword");
        _equipment_goals.emplace_back("Get Thunder Sword");
        _equipment_goals.emplace_back("Get Ice Sword");
        _equipment_goals.emplace_back("Get Sword of Gaia");
        _equipment_goals.emplace_back("Get Steel Breast");
        _equipment_goals.emplace_back("Get Chrome Breast");
        _equipment_goals.emplace_back("Get Shell Breast");
        _equipment_goals.emplace_back("Get Hyper Breast");
        vectools::shuffle(_equipment_goals, _rng);

        _global_equipment_goals.emplace_back("Get all swords");
        _global_equipment_goals.emplace_back("Get all armors");
        _global_equipment_goals.emplace_back("Get all rings");
        _global_equipment_goals.emplace_back("Get all boots");
        _global_equipment_goals.emplace_back("Equip 2nd column fully (Magic)");
        _global_equipment_goals.emplace_back("Equip 3rd column fully (Thunder)");
        _global_equipment_goals.emplace_back("Equip 4th column fully (Ice)");
        _global_equipment_goals.emplace_back("Equip 5th column fully (Gaia)");
        _global_equipment_goals.emplace_back("Equip a diagonal of equipments");
        vectools::shuffle(_global_equipment_goals, _rng);
    }